

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgssvx.c
# Opt level: O2

void cgssvx(superlu_options_t *options,SuperMatrix *A,int *perm_c,int *perm_r,int *etree,char *equed
           ,float *R,float *C,SuperMatrix *L,SuperMatrix *U,void *work,int_t lwork,SuperMatrix *B,
           SuperMatrix *X,float *recip_pivot_growth,float *rcond,float *ferr,float *berr,
           GlobalLU_t *Glu,mem_usage_t *mem_usage,SuperLUStat_t *stat,int_t *info)

{
  float fVar1;
  char cVar2;
  uint uVar3;
  trans_t tVar4;
  fact_t fVar5;
  yes_no_t yVar6;
  uint uVar7;
  int iVar8;
  int *piVar9;
  int *piVar10;
  double *pdVar11;
  int_t *piVar12;
  bool bVar13;
  char *pcVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  SuperMatrix *A_00;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  float in_XMM0_Da;
  float fVar29;
  float fVar30;
  double dVar31;
  double dVar32;
  float in_XMM1_Da;
  trans_t local_b4;
  float rowcnd;
  float colcnd;
  char norm [1];
  int info1;
  char *local_88;
  long local_80;
  long local_78;
  long local_70;
  int *local_68;
  float amax;
  long local_58;
  SuperMatrix AC;
  
  piVar9 = (int *)B->Store;
  piVar10 = (int *)X->Store;
  local_78 = *(long *)(piVar9 + 2);
  local_70 = *(long *)(piVar10 + 2);
  local_80 = (long)*piVar9;
  local_58 = (long)*piVar10;
  uVar3 = B->ncol;
  uVar17 = (ulong)uVar3;
  *info = 0;
  tVar4 = options->Trans;
  bVar26 = tVar4 == NOTRANS;
  fVar5 = options->Fact;
  yVar6 = options->Equil;
  local_68 = perm_r;
  if (fVar5 == FACTORED) {
    cVar2 = *equed;
    if (cVar2 == 'R') {
      bVar27 = true;
LAB_00102b9d:
      bVar28 = cVar2 == 'B';
    }
    else {
      bVar27 = cVar2 == 'B';
      if (cVar2 != 'C') goto LAB_00102b9d;
      bVar28 = true;
    }
    local_88 = equed;
    in_XMM0_Da = smach("Safe minimum");
    in_XMM1_Da = 1.0 / in_XMM0_Da;
    equed = local_88;
  }
  else {
    *equed = 'N';
    bVar27 = false;
    bVar28 = false;
  }
  iVar15 = -1;
  if (((options->Fact < 4) && (options->Trans < (CONJ|TRANS))) && (options->Equil < 2)) {
    iVar16 = A->nrow;
    iVar15 = -2;
    if (((-1 < (long)iVar16) && (iVar16 == A->ncol)) &&
       (((A->Stype & ~SLU_NR) == SLU_NC && ((A->Dtype == SLU_C && (A->Mtype == SLU_GE)))))) {
      if ((options->Fact != FACTORED) || (bVar28 || bVar27)) {
        if (bVar27) {
          fVar29 = 0.0;
          fVar30 = in_XMM1_Da;
          for (lVar20 = 0; iVar16 != lVar20; lVar20 = lVar20 + 1) {
            fVar1 = R[lVar20];
            if (fVar1 <= fVar30) {
              fVar30 = fVar1;
            }
            if (fVar29 <= fVar1) {
              fVar29 = fVar1;
            }
          }
          if (fVar30 <= 0.0) {
            iVar15 = -7;
            goto LAB_00102e90;
          }
          if (iVar16 < 1) {
            rowcnd = 1.0;
          }
          else {
            if (fVar30 <= in_XMM0_Da) {
              fVar30 = in_XMM0_Da;
            }
            if (in_XMM1_Da <= fVar29) {
              fVar29 = in_XMM1_Da;
            }
            rowcnd = fVar30 / fVar29;
          }
        }
        iVar15 = *info;
        if (bVar28) {
          if (iVar15 != 0) goto LAB_00102e95;
          uVar7 = A->nrow;
          uVar18 = 0;
          uVar19 = 0;
          if (0 < (int)uVar7) {
            uVar19 = (ulong)uVar7;
          }
          fVar29 = 0.0;
          fVar30 = in_XMM1_Da;
          for (; uVar19 != uVar18; uVar18 = uVar18 + 1) {
            fVar1 = C[uVar18];
            if (fVar1 <= fVar30) {
              fVar30 = fVar1;
            }
            if (fVar29 <= fVar1) {
              fVar29 = fVar1;
            }
          }
          if (fVar30 <= 0.0) {
            iVar15 = -8;
            goto LAB_00102e90;
          }
          if ((int)uVar7 < 1) {
            colcnd = 1.0;
          }
          else {
            if (fVar30 <= in_XMM0_Da) {
              fVar30 = in_XMM0_Da;
            }
            if (in_XMM1_Da <= fVar29) {
              fVar29 = in_XMM1_Da;
            }
            colcnd = fVar30 / fVar29;
          }
        }
        else {
LAB_00102d0a:
          if (iVar15 != 0) goto LAB_00102e95;
        }
        if (lwork < -1) {
          iVar16 = -0xc;
LAB_00102d62:
          *info = iVar16;
          bVar13 = false;
        }
        else {
          iVar16 = -0xd;
          if (B->ncol < 0) goto LAB_00102d62;
          bVar13 = true;
          if (B->ncol != 0) {
            iVar15 = 0;
            if (0 < A->nrow) {
              iVar15 = A->nrow;
            }
            if ((((*piVar9 < iVar15) || (B->Stype != SLU_DN)) || (B->Dtype != SLU_C)) ||
               (B->Mtype != SLU_GE)) goto LAB_00102d62;
          }
          iVar16 = 0;
        }
        iVar8 = X->ncol;
        iVar15 = -0xe;
        if (-1 < iVar8) {
          if (iVar8 != 0) {
            iVar23 = 0;
            if (0 < A->nrow) {
              iVar23 = A->nrow;
            }
            if (((*piVar10 < iVar23) || (B->ncol != 0 && B->ncol != iVar8)) ||
               ((X->Stype != SLU_DN || ((X->Dtype != SLU_C || (X->Mtype != SLU_GE))))))
            goto LAB_00102e90;
          }
          iVar15 = iVar16;
          if (bVar13) {
            iVar15 = sp_ienv(1);
            iVar16 = sp_ienv(2);
            pdVar11 = stat->utime;
            if (A->Stype == SLU_NR) {
              bVar26 = tVar4 != NOTRANS;
              local_b4 = (trans_t)(tVar4 == NOTRANS);
              piVar12 = (int_t *)A->Store;
              A_00 = (SuperMatrix *)superlu_malloc(0x20);
              cCreate_CompCol_Matrix
                        (A_00,A->ncol,A->nrow,*piVar12,*(singlecomplex **)(piVar12 + 2),
                         *(int_t **)(piVar12 + 4),*(int_t **)(piVar12 + 6),SLU_NC,A->Dtype,A->Mtype)
              ;
            }
            else {
              local_b4 = options->Trans;
              A_00 = A;
            }
            local_88 = equed;
            if ((fVar5 == FACTORED) || (yVar6 != YES)) {
              if (fVar5 == FACTORED) goto LAB_001030d2;
            }
            else {
              dVar31 = SuperLU_timer_();
              cgsequ(A_00,R,C,&rowcnd,&colcnd,&amax,&info1);
              pcVar14 = local_88;
              if (info1 == 0) {
                claqgs(A_00,R,C,rowcnd,colcnd,amax,local_88);
                cVar2 = *pcVar14;
                bVar27 = true;
                if ((cVar2 == 'R') || (bVar27 = cVar2 == 'B', cVar2 != 'C')) {
                  bVar28 = cVar2 == 'B';
                }
                else {
                  bVar28 = true;
                }
              }
              dVar32 = SuperLU_timer_();
              pdVar11[4] = dVar32 - dVar31;
            }
            dVar31 = SuperLU_timer_();
            if ((options->ColPerm != MY_PERMC) && (options->Fact == DOFACT)) {
              get_perm_c(options->ColPerm,A_00,perm_c);
            }
            dVar32 = SuperLU_timer_();
            *pdVar11 = dVar32 - dVar31;
            dVar31 = SuperLU_timer_();
            sp_preorder(options,A_00,perm_c,etree,&AC);
            dVar32 = SuperLU_timer_();
            pdVar11[3] = dVar32 - dVar31;
            dVar31 = SuperLU_timer_();
            cgstrf(options,&AC,iVar16,iVar15,etree,work,lwork,perm_c,local_68,L,U,Glu,stat,info);
            dVar32 = SuperLU_timer_();
            pdVar11[7] = dVar32 - dVar31;
            if (lwork == -1) {
              mem_usage->total_needed = (float)(*info - A->ncol);
              return;
            }
LAB_001030d2:
            iVar15 = *info;
            if (0 < iVar15) {
              if (A->ncol < iVar15) {
                return;
              }
              fVar29 = cPivotGrowth(iVar15,A_00,perm_c,L,U);
              *recip_pivot_growth = fVar29;
              return;
            }
            if (options->PivotGrowth != NO) {
              fVar29 = cPivotGrowth(A->ncol,A_00,perm_c,L,U);
              *recip_pivot_growth = fVar29;
            }
            if (options->ConditionNumber != NO) {
              dVar31 = SuperLU_timer_();
              norm[0] = 'I';
              if (bVar26) {
                norm[0] = '1';
              }
              fVar29 = clangs(norm,A_00);
              cgscon(norm,L,U,fVar29,rcond,stat,&info1);
              dVar32 = SuperLU_timer_();
              pdVar11[0x10] = dVar32 - dVar31;
            }
            if (0 < (int)uVar3) {
              if (bVar26) {
                if (bVar27) {
                  uVar19 = 0;
                  uVar18 = (ulong)(uint)A->nrow;
                  if (A->nrow < 1) {
                    uVar18 = uVar19;
                  }
                  lVar20 = local_78 + 4;
                  for (; uVar19 != uVar17; uVar19 = uVar19 + 1) {
                    for (uVar22 = 0; uVar18 != uVar22; uVar22 = uVar22 + 1) {
                      *(float *)(lVar20 + -4 + uVar22 * 8) =
                           *(float *)(lVar20 + -4 + uVar22 * 8) * R[uVar22];
                      *(float *)(lVar20 + uVar22 * 8) = *(float *)(lVar20 + uVar22 * 8) * R[uVar22];
                    }
                    lVar20 = lVar20 + local_80 * 8;
                  }
                }
              }
              else if (bVar28) {
                uVar19 = 0;
                uVar18 = (ulong)(uint)A->nrow;
                if (A->nrow < 1) {
                  uVar18 = uVar19;
                }
                lVar20 = local_78 + 4;
                for (; uVar19 != uVar17; uVar19 = uVar19 + 1) {
                  for (uVar22 = 0; uVar18 != uVar22; uVar22 = uVar22 + 1) {
                    *(float *)(lVar20 + -4 + uVar22 * 8) =
                         *(float *)(lVar20 + -4 + uVar22 * 8) * C[uVar22];
                    *(float *)(lVar20 + uVar22 * 8) = *(float *)(lVar20 + uVar22 * 8) * C[uVar22];
                  }
                  lVar20 = lVar20 + local_80 * 8;
                }
              }
              lVar25 = local_58 * 8;
              lVar20 = local_70;
              lVar24 = local_78;
              for (uVar18 = 0; uVar18 != uVar17; uVar18 = uVar18 + 1) {
                for (lVar21 = 0; lVar21 < B->nrow; lVar21 = lVar21 + 1) {
                  *(undefined8 *)(lVar20 + lVar21 * 8) = *(undefined8 *)(lVar24 + lVar21 * 8);
                }
                lVar24 = lVar24 + local_80 * 8;
                lVar20 = lVar20 + lVar25;
              }
              dVar31 = SuperLU_timer_();
              cgstrs(local_b4,L,U,perm_c,local_68,X,stat,&info1);
              dVar32 = SuperLU_timer_();
              pdVar11[0x11] = dVar32 - dVar31;
              dVar31 = SuperLU_timer_();
              if (options->IterRefine == NOREFINE) {
                for (uVar18 = 0; uVar17 != uVar18; uVar18 = uVar18 + 1) {
                  berr[uVar18] = 1.0;
                  ferr[uVar18] = 1.0;
                }
              }
              else {
                cgsrfs(local_b4,A_00,L,U,perm_c,local_68,local_88,R,C,B,X,ferr,berr,stat,&info1);
              }
              dVar32 = SuperLU_timer_();
              pdVar11[0x12] = dVar32 - dVar31;
              if (bVar26) {
                if (bVar28) {
                  uVar19 = 0;
                  uVar18 = (ulong)(uint)A->nrow;
                  if (A->nrow < 1) {
                    uVar18 = uVar19;
                  }
                  lVar20 = local_70 + 4;
                  for (; uVar19 != uVar17; uVar19 = uVar19 + 1) {
                    for (uVar22 = 0; uVar18 != uVar22; uVar22 = uVar22 + 1) {
                      *(float *)(lVar20 + -4 + uVar22 * 8) =
                           *(float *)(lVar20 + -4 + uVar22 * 8) * C[uVar22];
                      *(float *)(lVar20 + uVar22 * 8) = *(float *)(lVar20 + uVar22 * 8) * C[uVar22];
                    }
                    lVar20 = lVar20 + lVar25;
                  }
                }
              }
              else if (bVar27) {
                uVar19 = 0;
                uVar18 = (ulong)(uint)A->nrow;
                if (A->nrow < 1) {
                  uVar18 = uVar19;
                }
                lVar20 = local_70 + 4;
                for (; uVar19 != uVar17; uVar19 = uVar19 + 1) {
                  for (uVar22 = 0; uVar18 != uVar22; uVar22 = uVar22 + 1) {
                    *(float *)(lVar20 + -4 + uVar22 * 8) =
                         *(float *)(lVar20 + -4 + uVar22 * 8) * R[uVar22];
                    *(float *)(lVar20 + uVar22 * 8) = *(float *)(lVar20 + uVar22 * 8) * R[uVar22];
                  }
                  lVar20 = lVar20 + lVar25;
                }
              }
            }
            if ((options->ConditionNumber != NO) &&
               (fVar29 = *rcond, fVar30 = smach("E"), fVar29 < fVar30)) {
              *info = A->ncol + 1;
            }
            if (fVar5 != FACTORED) {
              cQuerySpace(L,U,mem_usage);
              Destroy_CompCol_Permuted(&AC);
            }
            if (A->Stype != SLU_NR) {
              return;
            }
            Destroy_SuperMatrix_Store(A_00);
            superlu_free(A_00);
            return;
          }
          goto LAB_00102e95;
        }
      }
      else {
        if (*equed == 'N') {
          iVar15 = *info;
          goto LAB_00102d0a;
        }
        iVar15 = -6;
      }
    }
  }
LAB_00102e90:
  *info = iVar15;
LAB_00102e95:
  AC.Stype = -iVar15;
  input_error("cgssvx",(int *)&AC);
  return;
}

Assistant:

void
cgssvx(superlu_options_t *options, SuperMatrix *A, int *perm_c, int *perm_r,
       int *etree, char *equed, float *R, float *C,
       SuperMatrix *L, SuperMatrix *U, void *work, int_t lwork,
       SuperMatrix *B, SuperMatrix *X, float *recip_pivot_growth, 
       float *rcond, float *ferr, float *berr, 
       GlobalLU_t *Glu, mem_usage_t *mem_usage, SuperLUStat_t *stat, int_t *info )
{

    DNformat  *Bstore, *Xstore;
    singlecomplex    *Bmat, *Xmat;
    int       ldb, ldx, nrhs;
    SuperMatrix *AA;/* A in SLU_NC format used by the factorization routine.*/
    SuperMatrix AC; /* Matrix postmultiplied by Pc */
    int       colequ, equil, nofact, notran, rowequ, permc_spec;
    trans_t   trant;
    char      norm[1];
    int       i, j, info1;
    float    amax, anorm, bignum, smlnum, colcnd, rowcnd, rcmax, rcmin;
    int       relax, panel_size;
    double    t0;      /* temporary time */
    double    *utime;

    /* External functions */
    extern float clangs(char *, SuperMatrix *);

    Bstore = B->Store;
    Xstore = X->Store;
    Bmat   = Bstore->nzval;
    Xmat   = Xstore->nzval;
    ldb    = Bstore->lda;
    ldx    = Xstore->lda;
    nrhs   = B->ncol;

    *info = 0;
    nofact = (options->Fact != FACTORED);
    equil = (options->Equil == YES);
    notran = (options->Trans == NOTRANS);
    if ( nofact ) {
	*(unsigned char *)equed = 'N';
	rowequ = FALSE;
	colequ = FALSE;
    } else {
	rowequ = strncmp(equed, "R", 1)==0 || strncmp(equed, "B", 1)==0;
	colequ = strncmp(equed, "C", 1)==0 || strncmp(equed, "B", 1)==0;
	smlnum = smach("Safe minimum");   /* lamch_("Safe minimum"); */
	bignum = 1. / smlnum;
    }

#if 0
printf("dgssvx: Fact=%4d, Trans=%4d, equed=%c\n",
       options->Fact, options->Trans, *equed);
#endif

    /* Test the input parameters */
    if ( (options->Fact != DOFACT && options->Fact != SamePattern &&
	  options->Fact != SamePattern_SameRowPerm &&
	  options->Fact != FACTORED) || 
	 (options->Trans != NOTRANS && options->Trans != TRANS && 
	  options->Trans != CONJ) ||
	 (options->Equil != NO && options->Equil != YES) )
	 *info = -1;
    else if ( A->nrow != A->ncol || A->nrow < 0 ||
	      (A->Stype != SLU_NC && A->Stype != SLU_NR) ||
	      A->Dtype != SLU_C || A->Mtype != SLU_GE )
	*info = -2;
    else if ( options->Fact == FACTORED &&
	     !(rowequ || colequ || strncmp(equed, "N", 1)==0) )
	*info = -6;
    else {
	if (rowequ) {
	    rcmin = bignum;
	    rcmax = 0.;
	    for (j = 0; j < A->nrow; ++j) {
		rcmin = SUPERLU_MIN(rcmin, R[j]);
		rcmax = SUPERLU_MAX(rcmax, R[j]);
	    }
	    if (rcmin <= 0.) *info = -7;
	    else if ( A->nrow > 0)
		rowcnd = SUPERLU_MAX(rcmin,smlnum) / SUPERLU_MIN(rcmax,bignum);
	    else rowcnd = 1.;
	}
	if (colequ && *info == 0) {
	    rcmin = bignum;
	    rcmax = 0.;
	    for (j = 0; j < A->nrow; ++j) {
		rcmin = SUPERLU_MIN(rcmin, C[j]);
		rcmax = SUPERLU_MAX(rcmax, C[j]);
	    }
	    if (rcmin <= 0.) *info = -8;
	    else if (A->nrow > 0)
		colcnd = SUPERLU_MAX(rcmin,smlnum) / SUPERLU_MIN(rcmax,bignum);
	    else colcnd = 1.;
	}
	if (*info == 0) {
	    if ( lwork < -1 ) *info = -12;
	    else if ( B->ncol < 0 ) *info = -13;
	    else if ( B->ncol > 0 ) { /* no checking if B->ncol=0 */
	         if ( Bstore->lda < SUPERLU_MAX(0, A->nrow) ||
		      B->Stype != SLU_DN || B->Dtype != SLU_C || 
		      B->Mtype != SLU_GE )
		*info = -13;
            }
	    if ( X->ncol < 0 ) *info = -14;
            else if ( X->ncol > 0 ) { /* no checking if X->ncol=0 */
                 if ( Xstore->lda < SUPERLU_MAX(0, A->nrow) ||
		      (B->ncol != 0 && B->ncol != X->ncol) ||
                      X->Stype != SLU_DN ||
		      X->Dtype != SLU_C || X->Mtype != SLU_GE )
		*info = -14;
            }
	}
    }
    if (*info != 0) {
	i = -(*info);
	input_error("cgssvx", &i);
	return;
    }
    
    /* Initialization for factor parameters */
    panel_size = sp_ienv(1);
    relax      = sp_ienv(2);

    utime = stat->utime;
    
    /* Convert A to SLU_NC format when necessary. */
    if ( A->Stype == SLU_NR ) {
	NRformat *Astore = A->Store;
	AA = (SuperMatrix *) SUPERLU_MALLOC( sizeof(SuperMatrix) );
	cCreate_CompCol_Matrix(AA, A->ncol, A->nrow, Astore->nnz, 
			       Astore->nzval, Astore->colind, Astore->rowptr,
			       SLU_NC, A->Dtype, A->Mtype);
	if ( notran ) { /* Reverse the transpose argument. */
	    trant = TRANS;
	    notran = 0;
	} else {
	    trant = NOTRANS;
	    notran = 1;
	}
    } else { /* A->Stype == SLU_NC */
	trant = options->Trans;
	AA = A;
    }

    if ( nofact && equil ) {
	t0 = SuperLU_timer_();
	/* Compute row and column scalings to equilibrate the matrix A. */
	cgsequ(AA, R, C, &rowcnd, &colcnd, &amax, &info1);
	
	if ( info1 == 0 ) {
	    /* Equilibrate matrix A. */
	    claqgs(AA, R, C, rowcnd, colcnd, amax, equed);
	    rowequ = strncmp(equed, "R", 1)==0 || strncmp(equed, "B", 1)==0;
	    colequ = strncmp(equed, "C", 1)==0 || strncmp(equed, "B", 1)==0;
	}
	utime[EQUIL] = SuperLU_timer_() - t0;
    }


    if ( nofact ) {
	
        t0 = SuperLU_timer_();
	/*
	 * Gnet column permutation vector perm_c[], according to permc_spec:
	 *   permc_spec = NATURAL:  natural ordering 
	 *   permc_spec = MMD_AT_PLUS_A: minimum degree on structure of A'+A
	 *   permc_spec = MMD_ATA:  minimum degree on structure of A'*A
	 *   permc_spec = COLAMD:   approximate minimum degree column ordering
	 *   permc_spec = MY_PERMC: the ordering already supplied in perm_c[]
	 */
	permc_spec = options->ColPerm;
	if ( permc_spec != MY_PERMC && options->Fact == DOFACT )
            get_perm_c(permc_spec, AA, perm_c);
	utime[COLPERM] = SuperLU_timer_() - t0;

	t0 = SuperLU_timer_();
	sp_preorder(options, AA, perm_c, etree, &AC);
	utime[ETREE] = SuperLU_timer_() - t0;
    
/*	printf("Factor PA = LU ... relax %d\tw %d\tmaxsuper %d\trowblk %d\n", 
	       relax, panel_size, sp_ienv(3), sp_ienv(4));
	fflush(stdout); */
	
	/* Compute the LU factorization of A*Pc. */
	t0 = SuperLU_timer_();
	cgstrf(options, &AC, relax, panel_size, etree,
                work, lwork, perm_c, perm_r, L, U, Glu, stat, info);
	utime[FACT] = SuperLU_timer_() - t0;
	
	if ( lwork == -1 ) {
	    mem_usage->total_needed = *info - A->ncol;
	    return;
	}
    }

    if ( *info > 0 ) { 
        if ( *info <= A->ncol ) { /* singular */
	    /* Compute the reciprocal pivot growth factor of the leading
	       rank-deficient (*info) columns of A. */
	    *recip_pivot_growth = cPivotGrowth(*info, AA, perm_c, L, U);
        }
	return;
    }

    /* *info == 0 at this point. */

    if ( options->PivotGrowth ) {
        /* Compute the reciprocal pivot growth factor *recip_pivot_growth. */
        *recip_pivot_growth = cPivotGrowth(A->ncol, AA, perm_c, L, U);
    }

    if ( options->ConditionNumber ) {
        /* Estimate the reciprocal of the condition number of A. */
        t0 = SuperLU_timer_();
        if ( notran ) {
	    *(unsigned char *)norm = '1';
        } else {
	    *(unsigned char *)norm = 'I';
        }
        anorm = clangs(norm, AA);
        cgscon(norm, L, U, anorm, rcond, stat, &info1);
        utime[RCOND] = SuperLU_timer_() - t0;
    }
    
    if ( nrhs > 0 ) {
        /* Scale the right hand side if equilibration was performed. */
        if ( notran ) {
	    if ( rowequ ) {
	        for (j = 0; j < nrhs; ++j)
		    for (i = 0; i < A->nrow; ++i)
                        cs_mult(&Bmat[i+j*ldb], &Bmat[i+j*ldb], R[i]);
	    }
        } else if ( colequ ) {
	    for (j = 0; j < nrhs; ++j)
	        for (i = 0; i < A->nrow; ++i)
                    cs_mult(&Bmat[i+j*ldb], &Bmat[i+j*ldb], C[i]);
        }

        /* Compute the solution matrix X. */
        for (j = 0; j < nrhs; j++)  /* Save a copy of the right hand sides */
            for (i = 0; i < B->nrow; i++)
	        Xmat[i + j*ldx] = Bmat[i + j*ldb];
    
        t0 = SuperLU_timer_();
        cgstrs (trant, L, U, perm_c, perm_r, X, stat, &info1);
        utime[SOLVE] = SuperLU_timer_() - t0;
    
        /* Use iterative refinement to improve the computed solution and compute
           error bounds and backward error estimates for it. */
        t0 = SuperLU_timer_();
        if ( options->IterRefine != NOREFINE ) {
            cgsrfs(trant, AA, L, U, perm_c, perm_r, equed, R, C, B,
                   X, ferr, berr, stat, &info1);
        } else {
            for (j = 0; j < nrhs; ++j) ferr[j] = berr[j] = 1.0;
        }
        utime[REFINE] = SuperLU_timer_() - t0;

        /* Transform the solution matrix X to a solution of the original system. */
        if ( notran ) {
	    if ( colequ ) {
	        for (j = 0; j < nrhs; ++j)
		    for (i = 0; i < A->nrow; ++i)
                        cs_mult(&Xmat[i+j*ldx], &Xmat[i+j*ldx], C[i]);
	    }
        } else if ( rowequ ) {
	    for (j = 0; j < nrhs; ++j)
	        for (i = 0; i < A->nrow; ++i)
                    cs_mult(&Xmat[i+j*ldx], &Xmat[i+j*ldx], R[i]);
        }
    } /* end if nrhs > 0 */

    if ( options->ConditionNumber ) {
        /* Set INFO = A->ncol+1 if the matrix is singular to working precision. */
        /*if ( *rcond < slamch_("E") ) *info = A->ncol + 1;*/
        if ( *rcond < smach("E") ) *info = A->ncol + 1;
    }

    if ( nofact ) {
        cQuerySpace(L, U, mem_usage);
        Destroy_CompCol_Permuted(&AC);
    }
    if ( A->Stype == SLU_NR ) {
	Destroy_SuperMatrix_Store(AA);
	SUPERLU_FREE(AA);
    }

}